

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

void google::protobuf::StrAppend(string *result,AlphaNum *a,AlphaNum *b,AlphaNum *c)

{
  size_type sVar1;
  pointer pcVar2;
  AlphaNum *pAVar3;
  LogMessage *pLVar4;
  pointer __dest;
  LogFinisher local_119;
  AlphaNum *local_118;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  local_118 = c;
  if ((ulong)((long)a->piece_data_ - (long)(result->_M_dataplus)._M_p) <= result->_M_string_length)
  {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x636);
    pLVar4 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: (uintptr_t((a).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar4);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if ((ulong)((long)b->piece_data_ - (long)(result->_M_dataplus)._M_p) <= result->_M_string_length)
  {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x637);
    pLVar4 = internal::LogMessage::operator<<
                       (&local_a0,
                        "CHECK failed: (uintptr_t((b).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=((LogFinisher *)&local_d8,pLVar4);
    internal::LogMessage::~LogMessage(&local_a0);
  }
  if ((ulong)((long)local_118->piece_data_ - (long)(result->_M_dataplus)._M_p) <=
      result->_M_string_length) {
    internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x638);
    pLVar4 = internal::LogMessage::operator<<
                       (&local_d8,
                        "CHECK failed: (uintptr_t((c).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar4);
    internal::LogMessage::~LogMessage(&local_d8);
  }
  pAVar3 = local_118;
  sVar1 = result->_M_string_length;
  std::__cxx11::string::resize
            ((ulong)result,
             (char)a->piece_size_ + (char)sVar1 + (char)b->piece_size_ +
             (char)local_118->piece_size_);
  pcVar2 = (result->_M_dataplus)._M_p;
  __dest = pcVar2 + sVar1;
  if (a->piece_size_ != 0) {
    memcpy(__dest,a->piece_data_,a->piece_size_);
    __dest = __dest + a->piece_size_;
  }
  if (b->piece_size_ != 0) {
    memcpy(__dest,b->piece_data_,b->piece_size_);
    __dest = __dest + b->piece_size_;
  }
  if (pAVar3->piece_size_ != 0) {
    memcpy(__dest,pAVar3->piece_data_,pAVar3->piece_size_);
    __dest = __dest + pAVar3->piece_size_;
  }
  if (__dest != pcVar2 + result->_M_string_length) {
    internal::LogMessage::LogMessage
              (&local_110,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x63e);
    pLVar4 = internal::LogMessage::operator<<
                       (&local_110,"CHECK failed: (out) == (begin + result->size()): ");
    internal::LogFinisher::operator=(&local_119,pLVar4);
    internal::LogMessage::~LogMessage(&local_110);
  }
  return;
}

Assistant:

void StrAppend(std::string *result, const AlphaNum &a, const AlphaNum &b,
               const AlphaNum &c) {
  GOOGLE_DCHECK_NO_OVERLAP(*result, a);
  GOOGLE_DCHECK_NO_OVERLAP(*result, b);
  GOOGLE_DCHECK_NO_OVERLAP(*result, c);
  std::string::size_type old_size = result->size();
  result->resize(old_size + a.size() + b.size() + c.size());
  char *const begin = &*result->begin();
  char *out = Append2(begin + old_size, a, b);
  out = Append1(out, c);
  GOOGLE_DCHECK_EQ(out, begin + result->size());
}